

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

IssuePtr __thiscall libcellml::Logger::error(Logger *this,size_t index)

{
  long *plVar1;
  ulong uVar2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *puVar4;
  IssuePtr IVar5;
  
  this->_vptr_Logger = (_func_int **)0x0;
  this->mPimpl = (LoggerImpl *)0x0;
  plVar1 = *(long **)(index + 8);
  if (in_RDX._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar1[1] - *plVar1 >> 3)) {
    uVar2 = *(ulong *)(*plVar1 + (long)in_RDX._M_pi * 8);
    if ((ulong)(plVar1[10] - plVar1[9] >> 4) <= uVar2) {
      uVar3 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (this->mPimpl != (LoggerImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->mPimpl);
      }
      _Unwind_Resume(uVar3);
    }
    puVar4 = (undefined8 *)(uVar2 * 0x10 + plVar1[9]);
    this->_vptr_Logger = (_func_int **)*puVar4;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->mPimpl,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar4 + 1));
    in_RDX._M_pi = extraout_RDX;
  }
  IVar5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  IVar5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Logger::error(size_t index) const
{
    IssuePtr issue = nullptr;
    if (index < pFunc()->mErrors.size()) {
        issue = pFunc()->mIssues.at(pFunc()->mErrors.at(index));
    }
    return issue;
}